

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool MultiplicationHelper<long,_int,_12>::Multiply(long *t,int u,long *ret)

{
  bool bVar1;
  undefined8 *in_RDX;
  bool f;
  int64_t tmp;
  int64_t t1;
  int32_t in_stack_ffffffffffffffcc;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  
  bVar1 = LargeIntRegMultiply<long,_int>::RegMultiply
                    ((int64_t *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc,(int64_t *)0x1b2a9b);
  *in_RDX = 0;
  return bVar1;
}

Assistant:

static bool Multiply( const T& t, U u, T& ret ) SAFEINT_NOTHROW
    {
        static_assert(safeint_internal::int_traits<T>::isInt64, "T must be Int64");
        std::int64_t t1 = t;
        std::int64_t tmp = 0;
        bool f = LargeIntRegMultiply< std::int64_t, std::int32_t >::RegMultiply( t1, (std::int32_t)u, &tmp);
        ret = tmp;
        return f;
    }